

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

int TIFFCheckRead(TIFF *tif,int tiles)

{
  char *fmt;
  int tiles_local;
  TIFF *tif_local;
  
  if (tif->tif_mode == 1) {
    TIFFErrorExtR(tif,tif->tif_name,"File not open for reading");
    tif_local._4_4_ = 0;
  }
  else if (tiles == (uint)((tif->tif_flags & 0x400) != 0)) {
    tif_local._4_4_ = 1;
  }
  else {
    fmt = "Can not read scanlines from a tiled image";
    if (tiles != 0) {
      fmt = "Can not read tiles from a striped image";
    }
    TIFFErrorExtR(tif,tif->tif_name,fmt);
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFCheckRead(TIFF *tif, int tiles)
{
    if (tif->tif_mode == O_WRONLY)
    {
        TIFFErrorExtR(tif, tif->tif_name, "File not open for reading");
        return (0);
    }
    if (tiles ^ isTiled(tif))
    {
        TIFFErrorExtR(tif, tif->tif_name,
                      tiles ? "Can not read tiles from a striped image"
                            : "Can not read scanlines from a tiled image");
        return (0);
    }
    return (1);
}